

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void minMaxValueFinalize(sqlite3_context *context,int bValue)

{
  Mem *pValue;
  
  if ((short)context->pMem->flags < 0) {
    pValue = (Mem *)context->pMem->z;
  }
  else {
    pValue = (Mem *)createAggContext(context,0);
  }
  if (pValue != (Mem *)0x0) {
    if (pValue->flags != 0) {
      sqlite3_result_value(context,pValue);
    }
    if ((bValue == 0) && (((pValue->flags & 0x9000) != 0 || (pValue->szMalloc != 0)))) {
      vdbeMemClear(pValue);
      return;
    }
  }
  return;
}

Assistant:

static void minMaxValueFinalize(sqlite3_context *context, int bValue){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    if( bValue==0 ) sqlite3VdbeMemRelease(pRes);
  }
}